

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O1

void av1_fwht4x4_c(int16_t *input,tran_low_t *output,int stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar21 [16];
  long lVar24;
  undefined4 uVar25;
  ulong uVar26;
  undefined4 uVar27;
  ulong uVar28;
  long lVar29;
  
  lVar5 = 0;
  do {
    iVar7 = (int)*(short *)((long)input + lVar5 + (long)stride * 2);
    sVar3 = *(short *)((long)input + lVar5 + (long)(stride * 2) * 2);
    lVar6 = (long)*(short *)((long)input + lVar5) + (long)iVar7;
    lVar4 = (long)*(short *)((long)input + lVar5 + (long)(stride * 3) * 2) - (long)sVar3;
    iVar8 = (int)((ulong)(lVar6 - lVar4) >> 1);
    iVar7 = iVar8 - iVar7;
    iVar8 = iVar8 - sVar3;
    output[lVar5 * 2] = (int)lVar6 - iVar8;
    output[lVar5 * 2 + 1] = iVar8;
    output[lVar5 * 2 + 2] = (int)lVar4 + iVar7;
    output[lVar5 * 2 + 3] = iVar7;
    lVar5 = lVar5 + 2;
  } while ((int)lVar5 != 8);
  auVar1 = *(undefined1 (*) [16])(output + 4);
  auVar2 = *(undefined1 (*) [16])(output + 0xc);
  uVar17 = auVar1._0_8_ & 0xffffffff;
  lVar15 = (ulong)(uint)output[2] + (ulong)auVar1._8_4_;
  lVar16 = (ulong)(uint)output[3] + (ulong)auVar1._12_4_;
  lVar9 = (uint)*output + uVar17;
  lVar10 = (ulong)(uint)output[1] + (ulong)auVar1._4_4_;
  lVar11 = (ulong)auVar2._8_4_ - (ulong)(uint)output[10];
  lVar12 = (ulong)auVar2._12_4_ - (ulong)(uint)output[0xb];
  lVar13 = (auVar2._0_8_ & 0xffffffff) - (ulong)(uint)output[8];
  lVar14 = (ulong)auVar2._4_4_ - (ulong)(uint)output[9];
  uVar26 = lVar9 - lVar13;
  uVar28 = lVar10 - lVar14;
  uVar22 = lVar16 - lVar12;
  uVar23 = uVar22 >> 1;
  auVar21._8_4_ = (undefined4)uVar23;
  auVar21._0_8_ = uVar23 << 0x20;
  auVar21._12_4_ = (int)((long)uVar22 >> 0x21);
  uVar22 = (ulong)(lVar15 - lVar11) >> 1 & 0xffffffff;
  iVar7 = (int)((long)uVar26 >> 0x21);
  iVar8 = (int)((long)uVar28 >> 0x21);
  uVar25 = (undefined4)(uVar26 >> 1);
  uVar27 = (undefined4)(uVar28 >> 1);
  lVar5 = CONCAT44(iVar7,uVar25);
  auVar2._8_4_ = uVar27;
  auVar2._0_8_ = lVar5;
  auVar2._12_4_ = iVar8;
  lVar5 = lVar5 - uVar17;
  lVar29 = auVar2._8_8_ - (ulong)auVar1._4_4_;
  lVar18 = uVar22 - auVar1._8_4_;
  lVar19 = auVar21._8_8_ - (ulong)auVar1._12_4_;
  lVar4 = CONCAT44(iVar7,uVar25) - (ulong)(uint)output[8];
  lVar6 = CONCAT44(iVar8,uVar27) - (ulong)(uint)output[9];
  lVar20 = uVar22 - (uint)output[10];
  lVar24 = auVar21._8_8_ - (ulong)(uint)output[0xb];
  *output = (int)(lVar9 - lVar4) << 2;
  output[1] = (int)(lVar10 - lVar6) << 2;
  output[2] = (int)(lVar15 - lVar20) << 2;
  output[3] = (int)(lVar16 - lVar24) << 2;
  output[4] = (int)lVar4 * 4;
  output[5] = (int)lVar6 * 4;
  output[6] = (int)lVar20 * 4;
  output[7] = (int)lVar24 * 4;
  output[8] = (int)(lVar13 + lVar5) << 2;
  output[9] = (int)(lVar14 + lVar29) << 2;
  output[10] = (int)(lVar11 + lVar18) << 2;
  output[0xb] = (int)(lVar12 + lVar19) << 2;
  output[0xc] = (int)lVar5 << 2;
  output[0xd] = (int)lVar29 << 2;
  output[0xe] = (int)lVar18 << 2;
  output[0xf] = (int)lVar19 << 2;
  return;
}

Assistant:

void av1_fwht4x4_c(const int16_t *input, tran_low_t *output, int stride) {
  int i;
  tran_high_t a1, b1, c1, d1, e1;
  const int16_t *ip_pass0 = input;
  const tran_low_t *ip = NULL;
  tran_low_t *op = output;

  for (i = 0; i < 4; i++) {
    a1 = ip_pass0[0 * stride];
    b1 = ip_pass0[1 * stride];
    c1 = ip_pass0[2 * stride];
    d1 = ip_pass0[3 * stride];

    a1 += b1;
    d1 = d1 - c1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= c1;
    d1 += b1;
    op[0] = (tran_low_t)a1;
    op[1] = (tran_low_t)c1;
    op[2] = (tran_low_t)d1;
    op[3] = (tran_low_t)b1;

    ip_pass0++;
    op += 4;
  }
  ip = output;
  op = output;

  for (i = 0; i < 4; i++) {
    a1 = ip[4 * 0];
    b1 = ip[4 * 1];
    c1 = ip[4 * 2];
    d1 = ip[4 * 3];

    a1 += b1;
    d1 -= c1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= c1;
    d1 += b1;
    op[4 * 0] = (tran_low_t)(a1 * UNIT_QUANT_FACTOR);
    op[4 * 1] = (tran_low_t)(c1 * UNIT_QUANT_FACTOR);
    op[4 * 2] = (tran_low_t)(d1 * UNIT_QUANT_FACTOR);
    op[4 * 3] = (tran_low_t)(b1 * UNIT_QUANT_FACTOR);

    ip++;
    op++;
  }
}